

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::Data
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,
          Data<QHashPrivate::Node<SubArray,_Macro>_> *other)

{
  uchar *puVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  Data *pDVar6;
  qsizetype qVar7;
  uchar uVar8;
  Node<SubArray,_Macro> *pNVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  R RVar14;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar11 = other->numBuckets;
  sVar12 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar12;
  this->spans = (Span *)0x0;
  RVar14 = allocateSpans(sVar11);
  this->spans = RVar14.spans;
  if (RVar14.nSpans != 0) {
    lVar10 = 0;
    sVar11 = 0;
    do {
      pSVar3 = other->spans;
      sVar12 = 0;
      do {
        bVar2 = pSVar3->offsets[sVar12 + lVar10];
        if (bVar2 != 0xff) {
          pEVar4 = pSVar3[sVar11].entries;
          uVar13 = (ulong)((uint)bVar2 * 0x60);
          pNVar9 = Span<QHashPrivate::Node<SubArray,_Macro>_>::insert(this->spans + sVar11,sVar12);
          pDVar5 = *(Data **)((pEVar4->storage).data + uVar13);
          (pNVar9->key).array.d.d = pDVar5;
          (pNVar9->key).array.d.ptr = *(char **)((pEVar4->storage).data + uVar13 + 8);
          (pNVar9->key).array.d.size = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x10);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value =
                 (Type)((int)(pDVar5->super_QArrayData).ref_._q_value + 1);
            UNLOCK();
          }
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x20);
          (pNVar9->key).from = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x18);
          (pNVar9->key).len = qVar7;
          puVar1 = (pEVar4->storage).data + uVar13 + 0x28;
          uVar8 = puVar1[1];
          (pNVar9->value).isFunction = (bool)puVar1[0];
          (pNVar9->value).isVariadic = (bool)uVar8;
          pDVar6 = *(Data **)((pEVar4->storage).data + uVar13 + 0x30);
          (pNVar9->value).arguments.d.d = pDVar6;
          (pNVar9->value).arguments.d.ptr = *(Symbol **)((pEVar4->storage).data + uVar13 + 0x38);
          (pNVar9->value).arguments.d.size = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x40);
          if (pDVar6 != (Data *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar6 = *(Data **)((pEVar4->storage).data + uVar13 + 0x48);
          (pNVar9->value).symbols.d.d = pDVar6;
          (pNVar9->value).symbols.d.ptr = *(Symbol **)((pEVar4->storage).data + uVar13 + 0x50);
          (pNVar9->value).symbols.d.size = *(qsizetype *)((pEVar4->storage).data + uVar13 + 0x58);
          if (pDVar6 != (Data *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != 0x80);
      sVar11 = sVar11 + 1;
      lVar10 = lVar10 + 0x90;
    } while (sVar11 != RVar14.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }